

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.hpp
# Opt level: O2

void __thiscall isotree::IsolationForest::~IsolationForest(IsolationForest *this)

{
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::~vector(&(this->indexer).indices);
  Imputer::~Imputer(&this->imputer);
  std::
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  ::~vector(&(this->model_ext).hplanes);
  std::
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  ::~vector(&(this->model).trees);
  return;
}

Assistant:

~IsolationForest() = default;